

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.cpp
# Opt level: O0

void __thiscall
presolve::HighsPostsolveStack::compressIndexMaps
          (HighsPostsolveStack *this,vector<int,_std::allocator<int>_> *newRowIndex,
          vector<int,_std::allocator<int>_> *newColIndex)

{
  value_type vVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  vector<int,_std::allocator<int>_> *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  long in_RDI;
  size_t i_1;
  HighsInt numCol;
  size_t i;
  HighsInt numRow;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  value_type in_stack_ffffffffffffffb4;
  size_type local_38;
  size_type local_28;
  
  std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)(in_RDI + 0x78))
  ;
  for (local_28 = 0; sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RSI), local_28 != sVar2
      ; local_28 = local_28 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,local_28);
    if (*pvVar3 != -1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x78),local_28);
      in_stack_ffffffffffffffb4 = *pvVar4;
      in_stack_ffffffffffffffa8 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x78);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,local_28);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (in_stack_ffffffffffffffa8,(long)*pvVar3);
      *pvVar4 = in_stack_ffffffffffffffb4;
    }
  }
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (size_type)in_stack_ffffffffffffffa8);
  std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60))
  ;
  for (local_38 = 0; sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RDX), local_38 != sVar2
      ; local_38 = local_38 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,local_38);
    if (*pvVar3 != -1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),local_38);
      vVar1 = *pvVar4;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,local_38);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)*pvVar3);
      *pvVar4 = vVar1;
    }
  }
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (size_type)in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void HighsPostsolveStack::compressIndexMaps(
    const std::vector<HighsInt>& newRowIndex,
    const std::vector<HighsInt>& newColIndex) {
  // loop over rows, decrease row counter for deleted rows (marked with -1),
  // store original index at new index position otherwise
  HighsInt numRow = origRowIndex.size();
  for (size_t i = 0; i != newRowIndex.size(); ++i) {
    if (newRowIndex[i] == -1)
      --numRow;
    else
      origRowIndex[newRowIndex[i]] = origRowIndex[i];
  }
  // resize original index array to new size
  origRowIndex.resize(numRow);

  // now compress the column array
  HighsInt numCol = origColIndex.size();
  for (size_t i = 0; i != newColIndex.size(); ++i) {
    if (newColIndex[i] == -1)
      --numCol;
    else
      origColIndex[newColIndex[i]] = origColIndex[i];
  }
  origColIndex.resize(numCol);
}